

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<ScenePreprocessorTest_testAnimationPreprocessingPos_Test>::
CreateTest(TestFactoryImpl<ScenePreprocessorTest_testAnimationPreprocessingPos_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<ScenePreprocessorTest_testAnimationPreprocessingPos_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x20);
  ScenePreprocessorTest_testAnimationPreprocessingPos_Test::
  ScenePreprocessorTest_testAnimationPreprocessingPos_Test
            ((ScenePreprocessorTest_testAnimationPreprocessingPos_Test *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }